

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ForkJoin.H
# Opt level: O2

Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> * __thiscall
amrex::ForkJoin::get_mf_vec
          (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *__return_storage_ptr__,
          ForkJoin *this,string *name)

{
  int iVar1;
  mapped_type *pmVar2;
  ulong uVar3;
  MultiFab *pMVar4;
  ulong uVar5;
  allocator_type local_29;
  
  pmVar2 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&this->data,name);
  uVar3 = ((long)(pmVar2->
                 super_vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>).
                 super__Vector_base<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pmVar2->
                super_vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>).
                super__Vector_base<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x50;
  iVar1 = (int)uVar3;
  std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            (&__return_storage_ptr__->
              super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>,(long)iVar1,
             &local_29);
  uVar5 = 0;
  uVar3 = uVar3 & 0xffffffff;
  if (iVar1 < 1) {
    uVar3 = uVar5;
  }
  for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    pMVar4 = get_mf(this,name,(int)uVar5);
    (__return_storage_ptr__->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_start[uVar5] = pMVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<MultiFab *> get_mf_vec (const std::string &name) {
        int dim = data.at(name).size();
        Vector<MultiFab *> result(dim);
        for (int idx = 0; idx < dim; ++idx) {
            result[idx] = &get_mf(name, idx);
        }
        return result;
    }